

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O2

int SUNMatMatvec_Dense(SUNMatrix A,N_Vector x,N_Vector y)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  N_Vector_ID NVar4;
  realtype *prVar5;
  realtype *prVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  NVar4 = N_VGetVectorID(x);
  if (((NVar4 != SUNDIALS_NVEC_SERIAL) && (NVar4 = N_VGetVectorID(x), NVar4 != SUNDIALS_NVEC_OPENMP)
      ) && (NVar4 = N_VGetVectorID(x), NVar4 != SUNDIALS_NVEC_PTHREADS)) {
    return -0x2bd;
  }
  prVar5 = N_VGetArrayPointer(x);
  prVar6 = N_VGetArrayPointer(y);
  iVar7 = -0x2be;
  if (prVar5 != prVar6 && (prVar6 != (realtype *)0x0 && prVar5 != (realtype *)0x0)) {
    puVar1 = (uint *)A->content;
    uVar8 = 0;
    uVar9 = (ulong)*puVar1;
    if ((int)*puVar1 < 1) {
      uVar9 = 0;
    }
    for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      prVar6[uVar8] = 0.0;
    }
    iVar7 = 0;
    uVar3 = puVar1[1];
    if ((int)puVar1[1] < 1) {
      uVar3 = 0;
    }
    for (uVar8 = 0; uVar8 != uVar3; uVar8 = uVar8 + 1) {
      lVar2 = *(long *)(*(long *)(puVar1 + 6) + uVar8 * 8);
      for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        prVar6[uVar10] = *(double *)(lVar2 + uVar10 * 8) * prVar5[uVar8] + prVar6[uVar10];
      }
    }
  }
  return iVar7;
}

Assistant:

int SUNMatMatvec_Dense(SUNMatrix A, N_Vector x, N_Vector y)
{
  sunindextype i, j;
  realtype *col_j, *xd, *yd;

  /* Verify that A, x and y are compatible */
  if (!SMCompatible2_Dense(A, x, y))
    return SUNMAT_ILL_INPUT;

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  yd = N_VGetArrayPointer(y);
  if ((xd == NULL) || (yd == NULL) || (xd == yd))
    return SUNMAT_MEM_FAIL;

  /* Perform operation */
  for (i=0; i<SM_ROWS_D(A); i++)
    yd[i] = ZERO;
  for(j=0; j<SM_COLUMNS_D(A); j++) {
    col_j = SM_COLUMN_D(A,j);
    for (i=0; i<SM_ROWS_D(A); i++)
      yd[i] += col_j[i]*xd[j];
  }
  return SUNMAT_SUCCESS;
}